

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningDecider.cpp
# Opt level: O0

bool __thiscall
InliningDecider::DeciderInlineIntoInliner
          (InliningDecider *this,FunctionBody *inlinee,FunctionBody *inliner,bool isConstructorCall,
          bool isPolymorphicCall,uint16 constantArgInfo,uint recursiveInlineDepth,
          bool allowRecursiveInlining)

{
  uint uVar1;
  undefined4 uVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  LocalFunctionId LVar6;
  uint32 uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char16 *pcVar12;
  undefined4 extraout_var_03;
  char16 *pcVar13;
  undefined4 extraout_var_04;
  char16 *pcVar14;
  DynamicProfileInfo *this_00;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  int local_260;
  int local_214;
  int local_1d8;
  wchar local_168 [4];
  char16 debugStringBuffer3 [42];
  wchar local_108 [4];
  char16 debugStringBuffer2 [42];
  wchar local_a8 [4];
  char16 debugStringBuffer [42];
  int inlineThreshold;
  uint16 mask;
  uint inlineeByteCodeCount;
  bool allowRecursiveInlining_local;
  uint16 constantArgInfo_local;
  bool isPolymorphicCall_local;
  bool isConstructorCall_local;
  FunctionBody *inliner_local;
  FunctionBody *inlinee_local;
  InliningDecider *this_local;
  
  bVar3 = CanRecursivelyInline(this,inlinee,inliner,allowRecursiveInlining,recursiveInlineDepth);
  if (!bVar3) {
    return false;
  }
  bVar3 = Js::ParseableFunctionInfo::GetIsAsmjsMode(&inliner->super_ParseableFunctionInfo);
  bVar4 = Js::ParseableFunctionInfo::GetIsAsmjsMode(&inlinee->super_ParseableFunctionInfo);
  if (bVar3 != bVar4) {
    return false;
  }
  uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inlinee);
  if (uVar5 != 0xfffffffe) {
    uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
    LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ea41a0,InlinePhase,uVar5,LVar6);
    if (!bVar3) {
      uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inliner);
      LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inliner);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ea41a0,InlinePhase,uVar5,LVar6);
      if (!bVar3) {
        uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inlinee);
        LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inlinee);
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ea41a0,InlinePhase,uVar5,LVar6);
        if (!bVar3) {
          uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
          LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
          bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,InlinePhase,uVar5,LVar6);
          if (!bVar3) {
            uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inliner);
            LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inliner);
            bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,InlinePhase,uVar5,LVar6);
            if (!bVar3) {
              uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inlinee);
              LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inlinee);
              bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,InlinePhase,uVar5,LVar6);
              if (!bVar3) {
                uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
                LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
                bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ea41a0,InlineTreePhase,uVar5,LVar6);
                if (!bVar3) {
                  uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inliner);
                  LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inliner);
                  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ea41a0,InlineTreePhase,uVar5,LVar6)
                  ;
                  if (!bVar3) {
                    uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inlinee);
                    LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inlinee);
                    bVar3 = Js::Phases::IsEnabled
                                      ((Phases *)&DAT_01ea41a0,InlineAtEveryCallerPhase,uVar5,LVar6)
                    ;
                    if (bVar3) {
                      return true;
                    }
                    uVar5 = Js::FunctionBody::GetByteCodeWithoutLDACount(inlinee);
                    debugStringBuffer[0x29] = constantArgInfo & inlinee->m_argUsedForBranch;
                    if ((debugStringBuffer[0x29] != L'\0') && (uVar5 < DAT_01eace30)) {
                      return true;
                    }
                    debugStringBuffer._76_4_ = (this->threshold).inlineThreshold;
                    if (((((!isPolymorphicCall) && (!isConstructorCall)) &&
                         (bVar3 = IsInlineeLeaf(inlinee), bVar3)) &&
                        (uVar11 = Js::FunctionBody::GetLoopCount(inlinee), uVar11 < 3)) &&
                       (((uVar11 = Js::FunctionBody::GetLoopCount(inlinee), uVar11 == 0 ||
                         (uVar7 = GetNumberOfInlineesWithLoop(this),
                         uVar7 <= (uint)(this->threshold).maxNumberOfInlineesWithLoop)) &&
                        (-1 < (this->threshold).leafInlineThreshold)))) {
                      debugStringBuffer._76_4_ =
                           ((this->threshold).leafInlineThreshold -
                           (this->threshold).inlineThreshold) + debugStringBuffer._76_4_;
                    }
                    bVar3 = Js::FunctionBody::GetHasLoops(inlinee);
                    if (bVar3) {
                      if ((((this->threshold).loopInlineThreshold < 0) ||
                          (uVar7 = GetNumberOfInlineesWithLoop(this),
                          (uint)(this->threshold).maxNumberOfInlineesWithLoop < uVar7)) ||
                         ((uVar11 = Js::FunctionBody::GetLoopCount(inlinee), 2 < uVar11 ||
                          ((bVar3 = Js::FunctionBody::GetHasNestedLoop(inlinee), bVar3 ||
                           (isConstructorCall)))))) {
LAB_0072eca3:
                        uVar5 = Js::FunctionProxy::GetSourceContextId
                                          ((FunctionProxy *)this->topFunc);
                        LVar6 = Js::FunctionProxy::GetLocalFunctionId
                                          ((FunctionProxy *)this->topFunc);
                        bVar3 = Js::Phases::IsEnabled
                                          ((Phases *)&DAT_01ec73f0,InlinePhase,uVar5,LVar6);
                        if (bVar3) {
                          uVar5 = Js::FunctionBody::GetByteCodeCount(inlinee);
                          uVar7 = GetNumberOfInlineesWithLoop(this);
                          uVar11 = Js::FunctionBody::GetLoopCount(inlinee);
                          bVar3 = Js::FunctionBody::GetHasNestedLoop(inlinee);
                          iVar8 = (*(inlinee->super_ParseableFunctionInfo).super_FunctionProxy.
                                    super_FinalizableObject.super_IRecyclerVisitedObject.
                                    _vptr_IRecyclerVisitedObject[7])();
                          pcVar12 = Js::FunctionProxy::GetDebugNumberSet
                                              ((FunctionProxy *)inlinee,(wchar (*) [42])local_a8);
                          iVar9 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.
                                    super_FinalizableObject.super_IRecyclerVisitedObject.
                                    _vptr_IRecyclerVisitedObject[7])();
                          pcVar13 = Js::FunctionProxy::GetDebugNumberSet
                                              ((FunctionProxy *)inliner,(wchar (*) [42])local_108);
                          iVar10 = (*(this->topFunc->super_ParseableFunctionInfo).
                                     super_FunctionProxy.super_FinalizableObject.
                                     super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])()
                          ;
                          pcVar14 = Js::FunctionProxy::GetDebugNumberSet
                                              ((FunctionProxy *)this->topFunc,
                                               (wchar (*) [42])local_168);
                          Output::Print(L"INLINING: Skip Inline: Has loops \tBytecode size: %d \tgetNumberOfInlineesWithLoop: %d\tloopCount: %d\thasNestedLoop: %d\tisConstructorCall:%d\tInlinee: %s (%s)\tCaller: %s (%s) \tRoot: %s (%s)\n"
                                        ,(ulong)uVar5,(ulong)uVar7,(ulong)uVar11,(ulong)bVar3,
                                        (ulong)isConstructorCall,CONCAT44(extraout_var,iVar8),
                                        pcVar12,CONCAT44(extraout_var_00,iVar9),pcVar13,
                                        CONCAT44(extraout_var_01,iVar10),pcVar14);
                          Output::Flush();
                        }
                        return false;
                      }
                      uVar11 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc)
                      ;
                      LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
                      bVar3 = Js::Phases::IsEnabled
                                        ((Phases *)&DAT_01eafdf0,InlineFunctionsWithLoopsPhase,
                                         uVar11,LVar6);
                      if (bVar3) goto LAB_0072eca3;
                      if ((this->threshold).loopInlineThreshold < (this->threshold).inlineThreshold)
                      {
                        local_1d8 = (this->threshold).inlineThreshold -
                                    (this->threshold).loopInlineThreshold;
                      }
                      else {
                        local_1d8 = 0;
                      }
                      debugStringBuffer._76_4_ = debugStringBuffer._76_4_ - local_1d8;
                    }
                    if (isPolymorphicCall) {
                      if (((this->threshold).polymorphicInlineThreshold < 0) || (isConstructorCall))
                      {
                        uVar5 = Js::FunctionProxy::GetSourceContextId
                                          ((FunctionProxy *)this->topFunc);
                        LVar6 = Js::FunctionProxy::GetLocalFunctionId
                                          ((FunctionProxy *)this->topFunc);
                        bVar3 = Js::Phases::IsEnabled
                                          ((Phases *)&DAT_01ec73f0,InlinePhase,uVar5,LVar6);
                        if (bVar3) {
                          uVar1 = (this->threshold).polymorphicInlineThreshold;
                          uVar5 = Js::FunctionBody::GetByteCodeCount(inlinee);
                          iVar8 = (*(inlinee->super_ParseableFunctionInfo).super_FunctionProxy.
                                    super_FinalizableObject.super_IRecyclerVisitedObject.
                                    _vptr_IRecyclerVisitedObject[7])();
                          pcVar12 = Js::FunctionProxy::GetDebugNumberSet
                                              ((FunctionProxy *)inlinee,(wchar (*) [42])local_a8);
                          iVar9 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.
                                    super_FinalizableObject.super_IRecyclerVisitedObject.
                                    _vptr_IRecyclerVisitedObject[7])();
                          pcVar13 = Js::FunctionProxy::GetDebugNumberSet
                                              ((FunctionProxy *)inliner,(wchar (*) [42])local_108);
                          iVar10 = (*(this->topFunc->super_ParseableFunctionInfo).
                                     super_FunctionProxy.super_FinalizableObject.
                                     super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])()
                          ;
                          pcVar14 = Js::FunctionProxy::GetDebugNumberSet
                                              ((FunctionProxy *)this->topFunc,
                                               (wchar (*) [42])local_168);
                          Output::Print(L"INLINING: Skip Inline: Polymorphic call under PolymorphicInlineThreshold: %d \tBytecode size: %d\tInlinee: %s (%s)\tCaller: %s (%s) \tRoot: %s (%s)\n"
                                        ,(ulong)uVar1,(ulong)uVar5,CONCAT44(extraout_var_02,iVar8),
                                        pcVar12,CONCAT44(extraout_var_03,iVar9),pcVar13,
                                        CONCAT44(extraout_var_04,iVar10),pcVar14);
                          Output::Flush();
                        }
                        return false;
                      }
                      if ((this->threshold).polymorphicInlineThreshold <
                          (this->threshold).inlineThreshold) {
                        local_214 = (this->threshold).inlineThreshold -
                                    (this->threshold).polymorphicInlineThreshold;
                      }
                      else {
                        local_214 = 0;
                      }
                      debugStringBuffer._76_4_ = debugStringBuffer._76_4_ - local_214;
                    }
                    if (isConstructorCall) {
                      uVar11 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc)
                      ;
                      LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
                      bVar3 = Js::Phases::IsEnabled
                                        ((Phases *)&DAT_01eafdf0,InlineConstructorsPhase,uVar11,
                                         LVar6);
                      if (!bVar3) {
                        uVar11 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inliner);
                        LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inliner);
                        bVar3 = Js::Phases::IsEnabled
                                          ((Phases *)&DAT_01eafdf0,InlineConstructorsPhase,uVar11,
                                           LVar6);
                        if (!bVar3) {
                          uVar11 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inlinee);
                          LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inlinee);
                          bVar3 = Js::Phases::IsEnabled
                                            ((Phases *)&DAT_01eafdf0,InlineConstructorsPhase,uVar11,
                                             LVar6);
                          if ((!bVar3) && ((DAT_01e9e319 & 1) != 0)) {
                            uVar11 = Js::FunctionProxy::GetSourceContextId
                                               ((FunctionProxy *)this->topFunc);
                            LVar6 = Js::FunctionProxy::GetLocalFunctionId
                                              ((FunctionProxy *)this->topFunc);
                            bVar3 = Js::Phases::IsEnabled
                                              ((Phases *)&DAT_01ea41a0,InlineConstructorsPhase,
                                               uVar11,LVar6);
                            if (!bVar3) {
                              uVar11 = Js::FunctionProxy::GetSourceContextId
                                                 ((FunctionProxy *)inliner);
                              LVar6 = Js::FunctionProxy::GetLocalFunctionId
                                                ((FunctionProxy *)inliner);
                              bVar3 = Js::Phases::IsEnabled
                                                ((Phases *)&DAT_01ea41a0,InlineConstructorsPhase,
                                                 uVar11,LVar6);
                              if (!bVar3) {
                                uVar11 = Js::FunctionProxy::GetSourceContextId
                                                   ((FunctionProxy *)inlinee);
                                LVar6 = Js::FunctionProxy::GetLocalFunctionId
                                                  ((FunctionProxy *)inlinee);
                                bVar3 = Js::Phases::IsEnabled
                                                  ((Phases *)&DAT_01ea41a0,InlineConstructorsPhase,
                                                   uVar11,LVar6);
                                if (!bVar3) {
                                  bVar3 = Js::FunctionBody::HasDynamicProfileInfo(inlinee);
                                  if (bVar3) {
                                    this_00 = Js::FunctionBody::GetAnyDynamicProfileInfo(inlinee);
                                    bVar3 = Js::DynamicProfileInfo::HasPolymorphicFldAccess(this_00)
                                    ;
                                    if (bVar3) {
                                      return true;
                                    }
                                  }
                                  if ((this->threshold).constructorInlineThreshold < 0) {
                                    uVar5 = Js::FunctionProxy::GetSourceContextId
                                                      ((FunctionProxy *)this->topFunc);
                                    LVar6 = Js::FunctionProxy::GetLocalFunctionId
                                                      ((FunctionProxy *)this->topFunc);
                                    bVar3 = Js::Phases::IsEnabled
                                                      ((Phases *)&DAT_01ec73f0,InlinePhase,uVar5,
                                                       LVar6);
                                    if (bVar3) {
                                      uVar5 = Js::FunctionBody::GetByteCodeCount(inlinee);
                                      iVar8 = (*(inlinee->super_ParseableFunctionInfo).
                                                super_FunctionProxy.super_FinalizableObject.
                                                super_IRecyclerVisitedObject.
                                                _vptr_IRecyclerVisitedObject[7])();
                                      pcVar12 = Js::FunctionProxy::GetDebugNumberSet
                                                          ((FunctionProxy *)inlinee,
                                                           (wchar (*) [42])local_a8);
                                      iVar9 = (*(inliner->super_ParseableFunctionInfo).
                                                super_FunctionProxy.super_FinalizableObject.
                                                super_IRecyclerVisitedObject.
                                                _vptr_IRecyclerVisitedObject[7])();
                                      pcVar13 = Js::FunctionProxy::GetDebugNumberSet
                                                          ((FunctionProxy *)inliner,
                                                           (wchar (*) [42])local_108);
                                      iVar10 = (*(this->topFunc->super_ParseableFunctionInfo).
                                                 super_FunctionProxy.super_FinalizableObject.
                                                 super_IRecyclerVisitedObject.
                                                 _vptr_IRecyclerVisitedObject[7])();
                                      pcVar14 = Js::FunctionProxy::GetDebugNumberSet
                                                          ((FunctionProxy *)this->topFunc,
                                                           (wchar (*) [42])local_168);
                                      Output::Print(
                                                  L"INLINING: Skip Inline: Constructor with no polymorphic field access \tBytecode size: %d\tInlinee: %s (%s)\tCaller: %s (%s) \tRoot: %s (%s)\n"
                                                  ,(ulong)uVar5,CONCAT44(extraout_var_05,iVar8),
                                                  pcVar12,CONCAT44(extraout_var_06,iVar9),pcVar13,
                                                  CONCAT44(extraout_var_07,iVar10),pcVar14);
                                      Output::Flush();
                                    }
                                    return false;
                                  }
                                  if ((this->threshold).constructorInlineThreshold <
                                      (this->threshold).inlineThreshold) {
                                    local_260 = (this->threshold).inlineThreshold -
                                                (this->threshold).constructorInlineThreshold;
                                  }
                                  else {
                                    local_260 = 0;
                                  }
                                  debugStringBuffer._76_4_ = debugStringBuffer._76_4_ - local_260;
                                  goto LAB_0072f37c;
                                }
                              }
                            }
                            return true;
                          }
                        }
                      }
                      return false;
                    }
LAB_0072f37c:
                    if (((this->threshold).forLoopBody & 1U) != 0) {
                      debugStringBuffer._76_4_ = (int)debugStringBuffer._76_4_ / DAT_01ea9f4c;
                    }
                    if ((0 < (int)debugStringBuffer._76_4_) &&
                       (uVar5 <= (uint)debugStringBuffer._76_4_)) {
                      uVar5 = Js::FunctionBody::GetLoopCount(inlinee);
                      if (uVar5 != 0) {
                        IncrementNumberOfInlineesWithLoop(this);
                      }
                      return true;
                    }
                    uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
                    LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
                    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase,uVar5,LVar6);
                    if (bVar3) {
                      uVar5 = Js::FunctionBody::GetByteCodeCount(inlinee);
                      uVar2 = debugStringBuffer._76_4_;
                      iVar8 = (*(inlinee->super_ParseableFunctionInfo).super_FunctionProxy.
                                super_FinalizableObject.super_IRecyclerVisitedObject.
                                _vptr_IRecyclerVisitedObject[7])();
                      pcVar12 = Js::FunctionProxy::GetDebugNumberSet
                                          ((FunctionProxy *)inlinee,(wchar (*) [42])local_a8);
                      iVar9 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.
                                super_FinalizableObject.super_IRecyclerVisitedObject.
                                _vptr_IRecyclerVisitedObject[7])();
                      pcVar13 = Js::FunctionProxy::GetDebugNumberSet
                                          ((FunctionProxy *)inliner,(wchar (*) [42])local_108);
                      iVar10 = (*(this->topFunc->super_ParseableFunctionInfo).super_FunctionProxy.
                                 super_FinalizableObject.super_IRecyclerVisitedObject.
                                 _vptr_IRecyclerVisitedObject[7])();
                      pcVar14 = Js::FunctionProxy::GetDebugNumberSet
                                          ((FunctionProxy *)this->topFunc,(wchar (*) [42])local_168)
                      ;
                      Output::Print(L"INLINING: Skip Inline: Too long \tBytecode size: %d\tThreshold: %d\tInlinee: %s (%s)\tCaller: %s (%s) \tRoot: %s (%s)\n"
                                    ,(ulong)uVar5,(ulong)(uint)uVar2,CONCAT44(extraout_var_08,iVar8)
                                    ,pcVar12,CONCAT44(extraout_var_09,iVar9),pcVar13,
                                    CONCAT44(extraout_var_10,iVar10),pcVar14);
                      Output::Flush();
                    }
                    return false;
                  }
                }
                return true;
              }
            }
          }
          return false;
        }
      }
    }
  }
  return true;
}

Assistant:

bool InliningDecider::DeciderInlineIntoInliner(Js::FunctionBody * inlinee, Js::FunctionBody * inliner, bool isConstructorCall, bool isPolymorphicCall, uint16 constantArgInfo, uint recursiveInlineDepth, bool allowRecursiveInlining)
{

    if (!CanRecursivelyInline(inlinee, inliner, allowRecursiveInlining, recursiveInlineDepth))
    {
        return false;
    }

    if (inliner->GetIsAsmjsMode() != inlinee->GetIsAsmjsMode())
    {
        return false;
    }
// Force inline all Js Builtins functions
// The existing JsBuiltInForceInline flag can work only when we explictly create scriptFunction
// We can also have methods that we define on the prototype like next of ArrayIterator for which we don't explictly create a script function
// TODO (megupta) : use forceInline for methods defined on the prototype using ObjectDefineProperty
    if (inlinee->GetSourceContextId() == Js::Constants::JsBuiltInSourceContextId ||
        PHASE_FORCE(Js::InlinePhase, this->topFunc) ||
        PHASE_FORCE(Js::InlinePhase, inliner) ||
        PHASE_FORCE(Js::InlinePhase, inlinee))
    {
        return true;
    }

    if (PHASE_OFF(Js::InlinePhase, this->topFunc) ||
        PHASE_OFF(Js::InlinePhase, inliner) ||
        PHASE_OFF(Js::InlinePhase, inlinee))
    {
        return false;
    }

    if (PHASE_FORCE(Js::InlineTreePhase, this->topFunc) ||
        PHASE_FORCE(Js::InlineTreePhase, inliner))
    {
        return true;
    }

    if (PHASE_FORCE(Js::InlineAtEveryCallerPhase, inlinee))
    {
        return true;
    }

    uint inlineeByteCodeCount = inlinee->GetByteCodeWithoutLDACount();

    // Heuristics are hit in the following order (Note *order* is important)
    // 1. Leaf function:  If the inlinee is a leaf (but not a constructor or a polymorphic call) inline threshold is LeafInlineThreshold (60). Also it can have max 1 loop
    // 2. Constant Function Argument: If the inlinee candidate has a constant argument and that argument is used for branching, then the inline threshold is ConstantArgumentInlineThreshold (157)
    // 3. InlineThreshold: If an inlinee candidate exceeds InlineThreshold just don't inline no matter what.

    // Following are additional constraint for an inlinee which meets InlineThreshold (Rule no 3)
    // 4. Rule for inlinee with loops:
    //      4a. Only single loop in inlinee is permitted.
    //      4b. Should not have polymorphic field access.
    //      4c. Should not be a constructor.
    //      4d. Should meet LoopInlineThreshold (25)
    // 5. Rule for polymorphic inlinee:
    //      4a. Should meet PolymorphicInlineThreshold (32)
    // 6. Rule for constructors:
    //       5a. Always inline if inlinee has polymorphic field access (as we have cloned runtime data).
    //       5b. If inlinee is monomorphic, inline only small constructors. They are governed by ConstructorInlineThreshold (21)
    // 7. Rule for inlinee which is not interpreted enough (as we might not have all the profile data):
    //       7a. As of now it is still governed by the InlineThreshold. Plan to play with this in future.
    // 8. Rest should be inlined.

    uint16 mask = constantArgInfo &  inlinee->m_argUsedForBranch;
    if (mask && inlineeByteCodeCount <  (uint)CONFIG_FLAG(ConstantArgumentInlineThreshold))
    {
        return true;
    }

    int inlineThreshold = threshold.inlineThreshold;
    if (!isPolymorphicCall && !isConstructorCall && IsInlineeLeaf(inlinee) && (inlinee->GetLoopCount() <= 2))
    {
        // Inlinee is a leaf function
        if (inlinee->GetLoopCount() == 0 || GetNumberOfInlineesWithLoop() <= (uint)threshold.maxNumberOfInlineesWithLoop) // Don't inlinee too many inlinees with loops.
        {
            // Negative LeafInlineThreshold disable the threshold
            if (threshold.leafInlineThreshold >= 0)
            {
                inlineThreshold += threshold.leafInlineThreshold - threshold.inlineThreshold;
            }
        }
    }

#if ENABLE_DEBUG_CONFIG_OPTIONS
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer3[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif

    if (inlinee->GetHasLoops())
    {
        if (threshold.loopInlineThreshold < 0 ||                                     // Negative LoopInlineThreshold disable inlining with loop
            GetNumberOfInlineesWithLoop()  >(uint)threshold.maxNumberOfInlineesWithLoop || // See if we are inlining too many inlinees with loops.
            (inlinee->GetLoopCount() > 2) ||                                         // Allow at most 2 loops.
            inlinee->GetHasNestedLoop() ||                                           // Nested loops are not a good inlinee candidate
            isConstructorCall ||                                                     // If the function is constructor with loops, don't inline.
            PHASE_OFF(Js::InlineFunctionsWithLoopsPhase, this->topFunc))
        {
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: Has loops \tBytecode size: %d \tgetNumberOfInlineesWithLoop: %d\tloopCount: %d\thasNestedLoop: %d\tisConstructorCall:%d\tInlinee: %s (%s)\tCaller: %s (%s) \tRoot: %s (%s)\n"),
                inlinee->GetByteCodeCount(),
                GetNumberOfInlineesWithLoop(),
                inlinee->GetLoopCount(),
                inlinee->GetHasNestedLoop(),
                isConstructorCall,
                inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer),
                inliner->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer2),
                topFunc->GetDisplayName(), topFunc->GetDebugNumberSet(debugStringBuffer3));
            // Don't inline function with loops
            return false;
        }
        else
        {
            inlineThreshold -= (threshold.inlineThreshold > threshold.loopInlineThreshold) ? threshold.inlineThreshold - threshold.loopInlineThreshold : 0;
        }
    }

    if (isPolymorphicCall)
    {
        if (threshold.polymorphicInlineThreshold < 0 ||                              // Negative PolymorphicInlineThreshold disable inlining
            isConstructorCall)
        {
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: Polymorphic call under PolymorphicInlineThreshold: %d \tBytecode size: %d\tInlinee: %s (%s)\tCaller: %s (%s) \tRoot: %s (%s)\n"),
                threshold.polymorphicInlineThreshold,
                inlinee->GetByteCodeCount(),
                inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer),
                inliner->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer2),
                topFunc->GetDisplayName(), topFunc->GetDebugNumberSet(debugStringBuffer3));
            return false;
        }
        else
        {
            inlineThreshold -= (threshold.inlineThreshold > threshold.polymorphicInlineThreshold) ? threshold.inlineThreshold - threshold.polymorphicInlineThreshold : 0;
        }
    }

    if (isConstructorCall)
    {
#pragma prefast(suppress: 6285, "logical-or of constants is by design")
        if (PHASE_OFF(Js::InlineConstructorsPhase, this->topFunc) ||
            PHASE_OFF(Js::InlineConstructorsPhase, inliner) ||
            PHASE_OFF(Js::InlineConstructorsPhase, inlinee) ||
            !CONFIG_FLAG(CloneInlinedPolymorphicCaches))
        {
            return false;
        }

        if (PHASE_FORCE(Js::InlineConstructorsPhase, this->topFunc) ||
            PHASE_FORCE(Js::InlineConstructorsPhase, inliner) ||
            PHASE_FORCE(Js::InlineConstructorsPhase, inlinee))
        {
            return true;
        }

        if (inlinee->HasDynamicProfileInfo() && inlinee->GetAnyDynamicProfileInfo()->HasPolymorphicFldAccess())
        {
            // As of now this is not dependent on bytecodeInlinedThreshold.
            return true;
        }

        // Negative ConstructorInlineThreshold always disable constructor inlining
        if (threshold.constructorInlineThreshold < 0)
        {
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: Constructor with no polymorphic field access \tBytecode size: %d\tInlinee: %s (%s)\tCaller: %s (%s) \tRoot: %s (%s)\n"),
                inlinee->GetByteCodeCount(),
                inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer),
                inliner->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer2),
                topFunc->GetDisplayName(), topFunc->GetDebugNumberSet(debugStringBuffer3));
            // Don't inline constructor that does not have a polymorphic field access, or if cloning polymorphic inline
            // caches is disabled
            return false;
        }
        else
        {
            inlineThreshold -= (threshold.inlineThreshold > threshold.constructorInlineThreshold) ? threshold.inlineThreshold - threshold.constructorInlineThreshold : 0;
        }
    }

    if (threshold.forLoopBody)
    {
        inlineThreshold /= CONFIG_FLAG(InlineInLoopBodyScaleDownFactor);
    }

    if (inlineThreshold > 0 && inlineeByteCodeCount <= (uint)inlineThreshold)
    {
        if (inlinee->GetLoopCount())
        {
            IncrementNumberOfInlineesWithLoop();
        }
        return true;
    }
    else
    {
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: Too long \tBytecode size: %d\tThreshold: %d\tInlinee: %s (%s)\tCaller: %s (%s) \tRoot: %s (%s)\n"),
            inlinee->GetByteCodeCount(),
            inlineThreshold,
            inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer),
            inliner->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer2),
            topFunc->GetDisplayName(), topFunc->GetDebugNumberSet(debugStringBuffer3));
        return false;
    }
}